

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O3

from_chars_result
absl::from_chars(Nonnull<const_char_*> first,Nonnull<const_char_*> last,double *value,
                chars_format fmt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  byte bVar8;
  int iVar9;
  undefined1 auVar10 [16];
  bool bVar11;
  ulong uVar12;
  anon_unknown_0 *paVar13;
  anon_unknown_0 *paVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  uint uVar20;
  CalculatedFloat *calculated;
  byte bVar21;
  uint uVar22;
  Nonnull<bool_*> in_R9;
  int iVar23;
  Nonnull<const_char_*> begin;
  bool negative;
  double dVar24;
  CalculatedFloat CVar25;
  from_chars_result fVar26;
  uint128 value_00;
  from_chars_result result;
  ParsedFloat hex_parse;
  from_chars_result local_78;
  char local_61;
  ParsedFloat local_60;
  
  local_78.ec = 0;
  negative = false;
  begin = first;
  if (first != last) {
    negative = *first == '-';
    begin = first + negative;
  }
  local_78.ptr = first;
  if (((fmt & hex) != 0) || ((long)last - (long)begin < 2)) {
    if ((fmt & hex) == 0) goto LAB_0011acfb;
    strings_internal::ParseFloat<16>(&local_60,begin,last,fmt);
    if (local_60.end != (Nonnull<const_char_*>)0x0) goto LAB_0011ad7a;
LAB_0011adb4:
    local_78.ec = invalid_argument;
    goto LAB_0011b11d;
  }
  if ((*begin == '0') && ((byte)(begin[1] | 0x20U) == 0x78)) {
    strings_internal::ParseFloat<16>(&local_60,begin + 2,last,fmt);
    if ((local_60.end == (Nonnull<const_char_*>)0x0) || (local_60.type != kNumber)) {
      if (fmt != scientific) {
        local_78.ptr = begin + 1;
        if (negative == false) {
          dVar24 = 0.0;
        }
        else {
          dVar24 = -0.0;
        }
        *value = dVar24;
        goto LAB_0011b11d;
      }
      goto LAB_0011adb4;
    }
LAB_0011ad7a:
    local_78.ptr = local_60.end;
    bVar11 = anon_unknown_0::HandleEdgeCase<double>(&local_60,negative,value);
    if (bVar11) goto LAB_0011b11d;
    CVar25 = anon_unknown_0::CalculateFromParsedHexadecimal<double>
                       ((anon_unknown_0 *)local_60.mantissa,
                        (ParsedFloat *)(ulong)(uint)local_60.exponent);
    calculated = (CalculatedFloat *)(ulong)(uint)CVar25.exponent;
    paVar13 = (anon_unknown_0 *)CVar25.mantissa;
  }
  else {
LAB_0011acfb:
    strings_internal::ParseFloat<10>(&local_60,begin,last,fmt);
    if (local_60.end == (Nonnull<const_char_*>)0x0) goto LAB_0011adb4;
    local_78.ptr = local_60.end;
    bVar11 = anon_unknown_0::HandleEdgeCase<double>(&local_60,negative,value);
    if (bVar11) goto LAB_0011b11d;
    if (local_60.subrange_begin == (char *)0x0) {
      if (local_60.exponent < -0x156) {
        if (negative == false) {
          dVar24 = 0.0;
        }
        else {
          dVar24 = -0.0;
        }
      }
      else {
        if (local_60.exponent < 0x135) {
          if ((anon_unknown_0 *)local_60.mantissa == (anon_unknown_0 *)0x0) {
            uVar20 = 0x40;
          }
          else {
            lVar16 = 0x3f;
            if ((anon_unknown_0 *)local_60.mantissa != (anon_unknown_0 *)0x0) {
              for (; local_60.mantissa >> lVar16 == 0; lVar16 = lVar16 + -1) {
              }
            }
            uVar20 = (uint)lVar16 ^ 0x3f;
          }
          in_R9 = (Nonnull<bool_*>)(local_60.mantissa << ((byte)uVar20 & 0x3f));
          uVar12 = (ulong)(local_60.exponent + 0x156);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = in_R9;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)((anonymous_namespace)::kPower10MantissaHighTable + uVar12 * 8);
          auVar2 = auVar2 * auVar5;
          iVar23 = local_60.exponent * 0x3526a >> 0x10;
          if (CARRY8(auVar2._0_8_,(ulong)in_R9) && (~auVar2._8_4_ & 0x1ff) == 0) {
            auVar3._8_8_ = 0;
            auVar3._0_8_ = in_R9;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = *(ulong *)((anonymous_namespace)::kPower10MantissaLowTable + uVar12 * 8);
            auVar10._8_8_ = 0;
            auVar10._0_8_ = SUB168(auVar3 * auVar6,8);
            auVar2 = auVar2 + auVar10;
            if (auVar2._0_8_ != -1 || (~auVar2._8_4_ & 0x1ff) != 0) goto LAB_0011af90;
            if (CARRY8(SUB168(auVar3 * auVar6,0),(ulong)in_R9)) goto LAB_0011ae2b;
            uVar17 = auVar2._8_8_ >> 0x3f;
            in_R9 = (Nonnull<bool_*>)(auVar2._8_8_ >> (9U - (auVar2[0xf] >> 7) & 0x3f));
          }
          else {
LAB_0011af90:
            uVar17 = auVar2._8_8_ >> 0x3f;
            in_R9 = (Nonnull<bool_*>)(auVar2._8_8_ >> (9U - (auVar2[0xf] >> 7) & 0x3f));
            if ((auVar2._0_8_ == 0) &&
               (((uint)in_R9 & 3) == 1 &&
                (auVar2 & (undefined1  [16])0x1ff) == (undefined1  [16])0x0)) goto LAB_0011ae2b;
          }
          lVar16 = (((long)(int)((iVar23 - uVar20) + 0x43f) - (uVar17 ^ 1)) + 1) -
                   (ulong)((ulong)(in_R9 + ((uint)in_R9 & 1)) >> 0x36 == 0);
          if (0xfffffffffffff801 < lVar16 - 0x7ffU) {
            dVar19 = (double)((ulong)(in_R9 + ((uint)in_R9 & 1)) >> 1 & 0xfffffffffffff |
                             lVar16 << 0x34);
            dVar24 = (double)((ulong)dVar19 | 0x8000000000000000);
            if (negative == false) {
              dVar24 = dVar19;
            }
            *value = dVar24;
            goto LAB_0011b11d;
          }
          goto LAB_0011ae2b;
        }
        if (negative == false) {
          dVar24 = 1.79769313486232e+308;
        }
        else {
          dVar24 = -1.79769313486232e+308;
        }
      }
      *value = dVar24;
      local_78.ec = result_out_of_range;
      goto LAB_0011b11d;
    }
    if (local_60.exponent < -0x156) {
      calculated = (CalculatedFloat *)0xfffe7961;
    }
    else {
      if (local_60.exponent < 0x135) {
        uVar12 = (ulong)(local_60.exponent + 0x156);
        iVar23 = local_60.exponent * 0x3526a >> 0x10;
LAB_0011ae2b:
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_60.mantissa;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = *(ulong *)((anonymous_namespace)::kPower10MantissaHighTable + uVar12 * 8);
        auVar7 = auVar1 * auVar4;
        uVar17 = auVar7._8_8_;
        uVar12 = auVar7._0_8_;
        iVar23 = iVar23 + -0x3f;
        lVar16 = 0x3f;
        if (uVar17 != 0) {
          for (; uVar17 >> lVar16 == 0; lVar16 = lVar16 + -1) {
          }
        }
        uVar20 = (uint)lVar16 ^ 0x3f;
        if (local_60.subrange_begin == (char *)0x0) {
          if (uVar12 == 0) {
            uVar22 = 0x40;
          }
          else {
            lVar16 = 0x3f;
            if (uVar12 != 0) {
              for (; uVar12 >> lVar16 == 0; lVar16 = lVar16 + -1) {
              }
            }
            uVar22 = (uint)lVar16 ^ 0x3f;
          }
          if (uVar17 == 0) {
            uVar20 = uVar22;
          }
          if ((uint)local_60.exponent < 0x1c) {
            iVar15 = ((uint)(uVar17 != 0) << 6 | 0xb) - uVar20;
            bVar21 = 1;
          }
          else {
            uVar20 = ((uint)(uVar17 != 0) * 0x40 + 1) - uVar20;
            bVar8 = (byte)uVar20 & 0x3f;
            uVar18 = uVar17 >> ((byte)uVar20 & 0x3f);
            bVar21 = 0;
            bVar11 = (uVar20 & 0x40) != 0;
            uVar12 = uVar12 >> bVar8 | uVar17 << 0x40 - bVar8;
            if (bVar11) {
              uVar12 = uVar18;
            }
            uVar17 = 0;
            if (!bVar11) {
              uVar17 = uVar18;
            }
            auVar7._8_8_ = uVar17;
            auVar7._0_8_ = uVar12;
            iVar23 = iVar23 + uVar20;
            iVar15 = 10;
          }
        }
        else {
          if (uVar12 == 0) {
            uVar22 = 0x40;
          }
          else {
            lVar16 = 0x3f;
            if (uVar12 != 0) {
              for (; uVar12 >> lVar16 == 0; lVar16 = lVar16 + -1) {
              }
            }
            uVar22 = (uint)lVar16 ^ 0x3f;
          }
          if (uVar17 == 0) {
            uVar20 = uVar22;
          }
          uVar20 = ((uint)(uVar17 != 0) << 6 | 6) - uVar20;
          bVar8 = (byte)uVar20 & 0x3f;
          uVar18 = uVar17 >> ((byte)uVar20 & 0x3f);
          bVar21 = 0;
          bVar11 = (uVar20 & 0x40) != 0;
          uVar12 = uVar12 >> bVar8 | uVar17 << 0x40 - bVar8;
          if (bVar11) {
            uVar12 = uVar18;
          }
          uVar17 = 0;
          if (!bVar11) {
            uVar17 = uVar18;
          }
          auVar7._8_8_ = uVar17;
          auVar7._0_8_ = uVar12;
          iVar23 = iVar23 + uVar20;
          iVar15 = 5;
        }
        value_00.lo_ = auVar7._8_8_;
        iVar9 = -0x432 - iVar23;
        if (-0x432 - iVar23 < iVar15) {
          iVar9 = iVar15;
        }
        value_00.hi_._0_4_ = iVar9;
        value_00.hi_._4_4_ = 0;
        paVar13 = (anon_unknown_0 *)
                  anon_unknown_0::ShiftRightAndRound
                            (auVar7._0_8_,value_00,(uint)bVar21,SUB81(&local_61,0),in_R9);
        if (local_61 == '\0') {
          bVar11 = anon_unknown_0::MustRoundUp((uint64_t)paVar13,iVar23 + iVar9,&local_60);
          paVar13 = paVar13 + bVar11;
        }
        paVar14 = (anon_unknown_0 *)0x10000000000000;
        if (paVar13 != (anon_unknown_0 *)0x20000000000000) {
          paVar14 = paVar13;
        }
        uVar22 = iVar23 + iVar9 + (uint)(paVar13 == (anon_unknown_0 *)0x20000000000000);
        uVar20 = 0xfffe7961;
        if (paVar14 != (anon_unknown_0 *)0x0) {
          uVar20 = uVar22;
        }
        calculated = (CalculatedFloat *)0x1869f;
        paVar13 = (anon_unknown_0 *)0x0;
        if ((int)uVar22 < 0x3cc) {
          calculated = (CalculatedFloat *)(ulong)uVar20;
          paVar13 = paVar14;
        }
        goto LAB_0011b113;
      }
      calculated = (CalculatedFloat *)0x1869f;
    }
    paVar13 = (anon_unknown_0 *)0x0;
  }
LAB_0011b113:
  anon_unknown_0::EncodeResult<double>(paVar13,calculated,negative,&local_78,value);
LAB_0011b11d:
  fVar26.ec = local_78.ec;
  fVar26.ptr = local_78.ptr;
  fVar26._12_4_ = 0;
  return fVar26;
}

Assistant:

from_chars_result from_chars(absl::Nonnull<const char*> first,
                             absl::Nonnull<const char*> last, double& value,
                             chars_format fmt) {
  return FromCharsImpl(first, last, value, fmt);
}